

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms.c
# Opt level: O1

int deleteFile(char *filepath)

{
  int fd;
  int iVar1;
  int iVar2;
  stat st;
  stat local_b0;
  
  iVar2 = 2;
  fd = open(filepath,2);
  if (fd < 0) {
    deleteFile_cold_2();
  }
  else {
    iVar2 = 0;
    memset(&local_b0,0,0x90);
    lstat(filepath,&local_b0);
    iVar1 = writeOver(fd,(int)local_b0.st_size,0x20000);
    if (iVar1 == 0) {
      close(fd);
      unlink(filepath);
    }
    else {
      deleteFile_cold_1();
      iVar2 = 3;
    }
  }
  return iVar2;
}

Assistant:

int deleteFile(const char *filepath) {
  int fd = open(filepath, O_RDWR);
  if (fd < 0) {
    fprintf(stderr, "Failed opening file.\n");
    return 2;
  }

  struct stat st = {};
  lstat(filepath, &st);
  if (writeOver(fd, st.st_size, BUF_SIZE)) {
    fprintf(stderr, "Error overwriting file.\n");
    return 3;
  }

  //close and delete file
  close(fd);
  unlink(filepath);
  return 0;
}